

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  Nes nes;
  ifstream fs;
  Nes NStack_268;
  istream local_218 [520];
  
  iVar1 = 1;
  if (argc == 2) {
    n_e_s::nes::Nes::Nes(&NStack_268);
    std::ifstream::ifstream(local_218,argv[1],_S_bin);
    n_e_s::nes::Nes::load_rom(&NStack_268,local_218);
    iVar1 = 10000000;
    do {
      n_e_s::nes::Nes::execute(&NStack_268);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    std::ifstream::~ifstream(local_218);
    n_e_s::nes::Nes::~Nes(&NStack_268);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 2) {
        return 1;
    }

    Nes nes;
    std::ifstream fs(argv[1], std::ios::binary);
    nes.load_rom(fs);

    for (uint32_t i = 0; i < 10'000'000; ++i) {
        nes.execute();
    }

    return 0;
}